

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<kj::String>::~Array(Array<kj::String> *this)

{
  String *pSVar1;
  size_t sVar2;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (String *)0x0) {
    sVar2 = this->size_;
    this->ptr = (String *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pSVar1,0x18,sVar2,sVar2,ArrayDisposer::Dispose_<kj::String>::destruct)
    ;
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }